

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

void fsqr0(uint64_t *res,uint64_t *x)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  uint64_t *os;
  uint64_t *res_i0;
  ulong uVar10;
  ulong uVar11;
  uint64_t out0;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  bn_sqr4(&local_68,x);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_68;
  uVar9 = SUB168(auVar3 * ZEXT816(0xffffffff00000001),0);
  uVar12 = uVar9 + uStack_50;
  uVar10 = (local_68 << 0x20) + uStack_60;
  uVar1 = (ulong)CARRY8(local_68 << 0x20,uStack_60);
  uVar2 = (local_68 >> 0x20) + local_58;
  uVar16 = uVar2 + uVar1;
  uVar1 = (ulong)(CARRY8(local_68 >> 0x20,local_58) || CARRY8(uVar2,uVar1));
  uVar13 = uVar12 + uVar1;
  uVar12 = SUB168(auVar3 * ZEXT816(0xffffffff00000001),8) + (ulong)CARRY8(uVar9,uStack_50) +
           (ulong)CARRY8(uVar12,uVar1);
  uVar14 = uVar10 >> 0x20;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  uVar9 = SUB168(auVar4 * ZEXT816(0xffffffff00000001),0);
  uVar11 = (uStack_60 << 0x20) + uVar16;
  uVar1 = (ulong)CARRY8(uStack_60 << 0x20,uVar16);
  uVar2 = uVar14 + uVar13;
  uVar15 = uVar2 + uVar1;
  uVar2 = (ulong)(CARRY8(uVar14,uVar13) || CARRY8(uVar2,uVar1));
  uVar10 = uVar9 + uVar2;
  uVar1 = uVar12 + local_48;
  uVar13 = uVar10 + uVar1;
  uVar14 = SUB168(auVar4 * ZEXT816(0xffffffff00000001),8) + (ulong)CARRY8(uVar9,uVar2) +
           (ulong)CARRY8(uVar10,uVar1);
  uVar1 = (ulong)CARRY8(uVar12,local_48);
  uVar9 = uVar14 + uStack_40;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar9 + uVar1;
  uVar10 = uVar11 >> 0x20;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar11;
  uVar11 = (uVar16 << 0x20) + uVar15;
  uVar2 = (ulong)CARRY8(uVar16 << 0x20,uVar15);
  uVar12 = uVar10 + uVar13;
  uVar17 = uVar12 + uVar2;
  auVar3 = auVar5 * ZEXT816(0xffffffff00000001) + auVar7 +
           ZEXT116(CARRY8(uVar10,uVar13) || CARRY8(uVar12,uVar2));
  uVar10 = auVar3._0_8_;
  uVar13 = auVar3._8_8_;
  uVar1 = (ulong)(CARRY8(uVar14,uStack_40) || CARRY8(uVar9,uVar1));
  uVar9 = uVar13 + local_38;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar9 + uVar1;
  uVar14 = uVar11 >> 0x20;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar11;
  uVar2 = (ulong)CARRY8(uVar15 << 0x20,uVar17);
  uVar12 = uVar14 + uVar10;
  auVar3 = auVar6 * ZEXT816(0xffffffff00000001) + auVar8 +
           ZEXT116(CARRY8(uVar14,uVar10) || CARRY8(uVar12,uVar2));
  uVar16 = auVar3._8_8_;
  uVar10 = (ulong)(CARRY8(uVar13,local_38) || CARRY8(uVar9,uVar1));
  uVar13 = uStack_30 + uVar16;
  *res = (uVar15 << 0x20) + uVar17;
  res[1] = uVar12 + uVar2;
  res[2] = auVar3._0_8_;
  res[3] = uVar13 + uVar10;
  uVar1 = *res;
  uVar2 = res[1];
  uVar9 = res[2];
  uVar11 = (ulong)(uVar2 < 0xffffffff || uVar2 - 0xffffffff < (ulong)(uVar1 != 0xffffffffffffffff));
  uVar12 = res[3];
  uVar14 = (ulong)(uVar9 < uVar11);
  uVar10 = (ulong)(CARRY8(uStack_30,uVar16) || CARRY8(uVar13,uVar10)) -
           (ulong)(uVar12 < 0xffffffff00000001 || uVar12 + 0xffffffff < uVar14);
  uVar13 = ~uVar10;
  *res = uVar1 + 1 & uVar13 | uVar1 & uVar10;
  res[1] = (uVar2 - 0xffffffff) - (ulong)(uVar1 != 0xffffffffffffffff) & uVar13 | uVar2 & uVar10;
  res[2] = uVar9 - uVar11 & uVar13 | uVar9 & uVar10;
  res[3] = uVar13 & (uVar12 + 0xffffffff) - uVar14 | uVar10 & uVar12;
  return;
}

Assistant:

static inline void fsqr0(uint64_t *res, uint64_t *x)
{
  uint64_t tmp[8U] = { 0U };
  bn_sqr4(tmp, x);
  mont_reduction(res, tmp);
}